

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.h
# Opt level: O0

int __thiscall
draco::PointCloud::GetAttributeIdByMetadataEntry(PointCloud *this,string *name,string *value)

{
  bool bVar1;
  AttributeMetadata *this_00;
  undefined8 in_RDX;
  PointCloud *in_RSI;
  unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *in_RDI;
  AttributeMetadata *att_metadata;
  string *in_stack_00000030;
  GeometryMetadata *in_stack_00000038;
  nullptr_t in_stack_ffffffffffffffc8;
  uint32_t unique_id;
  undefined4 local_4;
  
  unique_id = (uint32_t)((ulong)in_RDX >> 0x20);
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_4 = -1;
  }
  else {
    std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    operator->((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *
               )0x112f48);
    this_00 = GeometryMetadata::GetAttributeMetadataByStringEntry
                        (in_stack_00000038,in_stack_00000030,(string *)this);
    if (this_00 == (AttributeMetadata *)0x0) {
      local_4 = -1;
    }
    else {
      AttributeMetadata::att_unique_id(this_00);
      local_4 = GetAttributeIdByUniqueId(in_RSI,unique_id);
    }
  }
  return local_4;
}

Assistant:

int GetAttributeIdByMetadataEntry(const std::string &name,
                                    const std::string &value) const {
    if (metadata_ == nullptr) {
      return -1;
    }
    const AttributeMetadata *att_metadata =
        metadata_->GetAttributeMetadataByStringEntry(name, value);
    if (!att_metadata) {
      return -1;
    }
    return GetAttributeIdByUniqueId(att_metadata->att_unique_id());
  }